

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MMDPmxParser.h
# Opt level: O2

void __thiscall pmx::PmxIkLink::PmxIkLink(PmxIkLink *this)

{
  long lVar1;
  
  this->link_target = 0;
  this->angle_lock = '\0';
  for (lVar1 = -0xc; lVar1 != 0; lVar1 = lVar1 + 4) {
    *(undefined4 *)((long)this->min_radian + lVar1) = 0;
    *(undefined4 *)((long)this[1].max_radian + lVar1 + -8) = 0;
  }
  return;
}

Assistant:

PmxIkLink()
			: link_target(0)
			, angle_lock(0)
		{
			for (int i = 0; i < 3; ++i) {
				max_radian[i] = 0.0f;
				min_radian[i] = 0.0f;
			}
		}